

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STBase.cpp
# Opt level: O0

ostream * jbcoin::operator<<(ostream *out,STBase *t)

{
  ostream *poVar1;
  string local_38 [32];
  STBase *local_18;
  STBase *t_local;
  ostream *out_local;
  
  local_18 = t;
  t_local = (STBase *)out;
  (*t->_vptr_STBase[5])();
  poVar1 = std::operator<<(out,local_38);
  std::__cxx11::string::~string(local_38);
  return poVar1;
}

Assistant:

std::ostream&
operator<< (std::ostream& out, const STBase& t)
{
    return out << t.getFullText ();
}